

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.hpp
# Opt level: O0

RealType __thiscall
QuantLib::Problem::valueAndGradient
          (Problem *this,DynamicVector<double,_std::allocator<double>_> *grad_f,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 uVar1;
  
  *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 1;
  *(int *)((long)in_RDI + 0x3c) = *(int *)((long)in_RDI + 0x3c) + 1;
  uVar1 = (**(code **)(*(long *)*in_RDI + 0x20))((long *)*in_RDI,in_RSI,in_RDX);
  in_RDI[5] = uVar1;
  (**(code **)(*(long *)in_RDI[8] + 0x10))
            (in_RDI[5],(long *)in_RDI[8],*(undefined4 *)(in_RDI + 7),
             *(undefined4 *)((long)in_RDI + 0x3c),in_RDI + 2);
  return (RealType)in_RDI[5];
}

Assistant:

inline RealType Problem::valueAndGradient(DynamicVector<RealType>& grad_f,
                                            const DynamicVector<RealType>& x) {
    ++functionEvaluation_;
    ++gradientEvaluation_;
    functionValue_ = objectiveFunction_.valueAndGradient(grad_f, x);
    statusFunction_.writeStatus(functionEvaluation_, gradientEvaluation_,
                                currentValue_, functionValue_);
    return functionValue_;
  }